

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::logic_t>::emplaceRealloc<slang::logic_t>
          (SmallVectorBase<slang::logic_t> *this,pointer pos,logic_t *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator plVar4;
  long lVar5;
  pointer plVar6;
  EVP_PKEY_CTX *ctx;
  uint8_t *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::logic_t> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  logic_t *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::logic_t> *)0x684abb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  plVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)plVar4;
  plVar6 = (pointer)operator_new(0x684b16);
  plVar6[lVar5].value = *in_RDX;
  plVar4 = end(in_RDI);
  if (in_RSI == plVar4) {
    plVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::logic_t*,slang::logic_t*>(in_RSI,__last,plVar4);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::logic_t*,slang::logic_t*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::logic_t*,slang::logic_t*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = plVar6;
  return plVar6 + lVar5;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}